

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorBytesToNz(VP8EncIterator *it)

{
  int *left_nz;
  int *top_nz;
  uint32_t nz;
  VP8EncIterator *it_local;
  
  *it->nz_ = it->left_nz_[4] << 0x11 | it->left_nz_[6] << 0x15 |
             it->left_nz_[2] << 0xb |
             it->left_nz_[0] << 3 | it->left_nz_[1] << 7 |
             it->top_nz_[8] << 0x18 |
             it->top_nz_[6] << 0x16 | it->top_nz_[7] << 0x17 |
             it->top_nz_[4] << 0x12 | it->top_nz_[5] << 0x13 |
             it->top_nz_[2] << 0xe | it->top_nz_[3] << 0xf |
             it->top_nz_[0] << 0xc | it->top_nz_[1] << 0xd;
  return;
}

Assistant:

void VP8IteratorBytesToNz(VP8EncIterator* const it) {
  uint32_t nz = 0;
  const int* const top_nz = it->top_nz_;
  const int* const left_nz = it->left_nz_;
  // top
  nz |= (top_nz[0] << 12) | (top_nz[1] << 13);
  nz |= (top_nz[2] << 14) | (top_nz[3] << 15);
  nz |= (top_nz[4] << 18) | (top_nz[5] << 19);
  nz |= (top_nz[6] << 22) | (top_nz[7] << 23);
  nz |= (top_nz[8] << 24);  // we propagate the _top_ bit, esp. for intra4
  // left
  nz |= (left_nz[0] << 3) | (left_nz[1] << 7);
  nz |= (left_nz[2] << 11);
  nz |= (left_nz[4] << 17) | (left_nz[6] << 21);

  *it->nz_ = nz;
}